

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::OpaqueAttribute::OpaqueAttribute
          (OpaqueAttribute *this,char *typeName,long dataSize,void *data)

{
  char *__dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _func_int **in_RDX;
  Attribute *in_RDI;
  Array<char> *this_00;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  Attribute::Attribute(in_RDI);
  in_RDI->_vptr_Attribute = (_func_int **)&PTR__OpaqueAttribute_002acd48;
  this_00 = (Array<char> *)(in_RDI + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
  in_RDI[5]._vptr_Attribute = in_RDX;
  Array<char>::Array((Array<char> *)(in_RDI + 6));
  Array<char>::resizeErase(this_00,(long)in_RDI);
  __dest = Array::operator_cast_to_char_((Array *)(in_RDI + 6));
  memcpy(__dest,in_RCX,(size_t)in_RDX);
  return;
}

Assistant:

OpaqueAttribute::OpaqueAttribute (const char  typeName[],
                                  long        dataSize,
                                  const void* data)
    : _typeName (typeName), _dataSize (dataSize)
{
    _data.resizeErase (dataSize);
    memcpy ((char*) _data, (const char*) data, dataSize);
}